

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[16],char_const*,char[50],std::__cxx11::string,char[231]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [47],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [10],char **Args_4,char (*Args_5) [47],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [16],char **Args_8,char (*Args_9) [50],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_10,
          char (*Args_11) [231])

{
  stringstream local_1e8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [10];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [47];
  
  std::__cxx11::stringstream::stringstream(local_1e8);
  FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[16],char_const*,char[50],std::__cxx11::string,char[231]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             (char (*) [47])this,(char **)Args,(char (*) [15])Args_1,(char (*) [10])Args_2,
             (char **)Args_3,(char (*) [47])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [16])Args_6,(char **)Args_7,(char (*) [50])Args_8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_9,
             (char (*) [231])Args_10);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}